

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

GenvarDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::GenvarDeclarationSyntax,slang::syntax::GenvarDeclarationSyntax_const&>
          (BumpAllocator *this,GenvarDeclarationSyntax *args)

{
  GenvarDeclarationSyntax *this_00;
  
  this_00 = (GenvarDeclarationSyntax *)allocate(this,0xa8,8);
  slang::syntax::GenvarDeclarationSyntax::GenvarDeclarationSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }